

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::init_tree(memory_tree *b)

{
  node *pnVar1;
  size_t sVar2;
  example *peVar3;
  ostream *poVar4;
  node local_58;
  
  b->iter = 0;
  b->routers_used = 0;
  b->test_mode = false;
  b->max_depth = 0;
  b->max_ex_in_leaf = 0;
  *(undefined8 *)((long)&b->max_ex_in_leaf + 4) = 0;
  b->test_time = 0.0;
  b->num_mistakes = 0;
  b->top_K = 1;
  b->F1_score = 0.0;
  b->hamming_loss = 0.0;
  local_58.parent = 0;
  local_58.internal = 0;
  local_58.depth = 0;
  local_58.base_router = 0;
  local_58.left = 0;
  local_58.right = 0;
  local_58.nl = 0.001;
  local_58.nr = 0.001;
  local_58.examples_index._begin = (uint *)0x0;
  local_58.examples_index._end = (uint *)0x0;
  local_58.examples_index.end_array = (uint *)0x0;
  local_58.examples_index.erase_count = 0;
  v_array<memory_tree_ns::node>::push_back(&b->nodes,&local_58);
  ((b->nodes)._begin)->internal = -1;
  pnVar1 = (b->nodes)._begin;
  sVar2 = b->routers_used;
  b->routers_used = sVar2 + 1;
  pnVar1->base_router = (uint32_t)sVar2;
  peVar3 = calloc_or_throw<example>();
  b->kprod_ec = peVar3;
  b->total_num_queries = 0;
  b->max_routers = b->max_nodes;
  poVar4 = std::operator<<((ostream *)&std::cout,"tree initiazliation is done....");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"max nodes ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"tree size: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"max number of unique labels: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"learn at leaf: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,b->learn_at_leaf);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"num of dream operations per example: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"current_pass: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<(poVar4,"oas: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,b->oas);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void init_tree(memory_tree& b)
    {
        //srand48(4000);
        //simple initilization: initilize the root only
        b.iter = 0;
        b.num_mistakes = 0;
        b.routers_used = 0;
        b.test_mode = false;
        b.max_depth = 0;
        b.max_ex_in_leaf = 0;
        b.construct_time = 0;
        b.test_time = 0;
        b.top_K = 1;
        b.hamming_loss = 0.f;
        b.F1_score = 0.f;

        b.nodes.push_back(node());
        b.nodes[0].internal = -1; //mark the root as leaf
        b.nodes[0].base_router = (b.routers_used++);

        b.kprod_ec = &calloc_or_throw<example>(); //allocate space for kronecker product example

        b.total_num_queries = 0;
        b.max_routers = b.max_nodes;
        cout<<"tree initiazliation is done...."<<endl
            <<"max nodes "<<b.max_nodes<<endl
            <<"tree size: "<<b.nodes.size()<<endl
            <<"max number of unique labels: "<<b.max_num_labels<<endl
            <<"learn at leaf: "<<b.learn_at_leaf<<endl
            <<"num of dream operations per example: "<<b.dream_repeats<<endl
            <<"current_pass: "<<b.current_pass<<endl
            <<"oas: "<<b.oas<<endl;
    }